

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRetF.c
# Opt level: O2

Aig_Man_t * Aig_ManRetimeFrontier(Aig_Man_t *p,int nStepsMax)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  Aig_Man_t *pAVar8;
  ulong uVar9;
  int iVar10;
  int i;
  
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRetF.c"
                  ,0x81,"Aig_Man_t *Aig_ManRetimeFrontier(Aig_Man_t *, int)");
  }
  Aig_TableClear(p);
  Aig_ManRetimeMark(p);
  for (iVar10 = 0; iVar10 < p->nRegs; iVar10 = iVar10 + 1) {
    pAVar4 = Aig_ManLi(p,iVar10);
    pAVar5 = Aig_ManLo(p,iVar10);
    pAVar5->field_0x18 = pAVar5->field_0x18 | 0x10;
    (pAVar5->field_0).pNext = pAVar4;
    (pAVar4->field_0).pNext = pAVar5;
  }
  iVar10 = 0;
  bVar1 = true;
  do {
    if (!bVar1) {
      for (iVar10 = 0; iVar10 < p->nRegs; iVar10 = iVar10 + 1) {
        pAVar4 = Aig_ManLi(p,iVar10);
        pAVar5 = Aig_ManLo(p,iVar10);
        pAVar5->field_0x18 = pAVar5->field_0x18 & 0xef;
        (pAVar4->field_0).pNext = (Aig_Obj_t *)0x0;
        (pAVar5->field_0).pNext = (Aig_Obj_t *)0x0;
      }
      for (iVar10 = 0; iVar10 < p->vObjs->nSize; iVar10 = iVar10 + 1) {
        pvVar7 = Vec_PtrEntry(p->vObjs,iVar10);
        if (pvVar7 != (void *)0x0) {
          *(byte *)((long)pvVar7 + 0x18) = *(byte *)((long)pvVar7 + 0x18) & 0xdf;
        }
      }
      Aig_ManSeqCleanup(p);
      pAVar8 = Aig_ManDupOrdered(p);
      return pAVar8;
    }
    bVar1 = false;
    for (i = 0; i < p->vObjs->nSize; i = i + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,i);
      bVar2 = bVar1;
      if (pAVar4 != (Aig_Obj_t *)0x0) {
        uVar3 = (uint)*(ulong *)&pAVar4->field_0x18 & 7;
        if (((uVar3 != 4) && ((*(ulong *)&pAVar4->field_0x18 & 0x20) != 0)) &&
           (0xfffffffd < uVar3 - 7)) {
          pAVar5 = Aig_ObjReal_rec(pAVar4->pFanin0);
          pAVar6 = Aig_ObjReal_rec(pAVar4->pFanin1);
          if (((*(byte *)((long *)((ulong)pAVar5 & 0xfffffffffffffffe) + 3) & 0x10) != 0) &&
             ((*(byte *)((long *)((ulong)pAVar6 & 0xfffffffffffffffe) + 3) & 0x10) != 0)) {
            uVar3 = (uint)pAVar5 & 1;
            uVar9 = (ulong)(uVar3 & (uint)pAVar6);
            pAVar5 = Aig_And(p,(Aig_Obj_t *)
                               ((ulong)uVar3 ^
                               *(ulong *)(*(long *)((ulong)pAVar5 & 0xfffffffffffffffe) + 8)),
                             (Aig_Obj_t *)
                             ((ulong)((uint)pAVar6 & 1) ^
                             *(ulong *)(*(long *)((ulong)pAVar6 & 0xfffffffffffffffe) + 8)));
            pAVar5->field_0x18 = pAVar5->field_0x18 | 0x20;
            pAVar6 = Aig_ObjCreateCi(p);
            pAVar6->field_0x18 = pAVar6->field_0x18 | 0x10;
            pAVar5 = Aig_ObjCreateCo(p,(Aig_Obj_t *)((ulong)pAVar5 ^ uVar9));
            p->nRegs = p->nRegs + 1;
            (pAVar6->field_0).pNext = pAVar5;
            (pAVar5->field_0).pNext = pAVar6;
            Aig_ObjDisconnect(p,pAVar4);
            *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xfffffffffffffff8 | 4;
            *(ulong *)(p->nObjs + 4) =
                 CONCAT44((int)((ulong)*(undefined8 *)(p->nObjs + 4) >> 0x20) + -1,
                          (int)*(undefined8 *)(p->nObjs + 4) + 1);
            bVar1 = false;
            Aig_ObjConnect(p,pAVar4,(Aig_Obj_t *)(uVar9 ^ (ulong)pAVar6),(Aig_Obj_t *)0x0);
            iVar10 = iVar10 + 1;
            bVar2 = true;
            if (nStepsMax <= iVar10) break;
          }
        }
      }
      bVar1 = bVar2;
    }
  } while( true );
}

Assistant:

Aig_Man_t * Aig_ManRetimeFrontier( Aig_Man_t * p, int nStepsMax )
{
    Aig_Obj_t * pObj, * pObjNew, * pObjLo, * pObjLo0, * pObjLo1, * pObjLi, * pObjLi0, * pObjLi1;//, * pObjLi0_, * pObjLi1_, * pObjLi0__, * pObjLi1__;
    int i, Counter, fCompl, fChange;
    assert( Aig_ManRegNum(p) > 0 );
    // remove structural hashing table
    Aig_TableClear( p );
    // mark the retimable nodes
    Aig_ManRetimeMark( p );
    // mark the register outputs
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        pObjLo->fMarkA = 1;
        pObjLo->pNext = pObjLi;
        pObjLi->pNext = pObjLo;
    }
    // go through the nodes and find retimable ones
    Counter = 0;
    fChange = 1;
    while ( fChange )
    {
        fChange = 0;
        Aig_ManForEachNode( p, pObj, i )
        {
            if ( !pObj->fMarkB )
                continue;
            if ( Aig_ObjIsBuf(pObj) )
                continue;
            // get the real inputs of the node (skipping the buffers)
            pObjLo0 = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
            pObjLo1 = Aig_ObjReal_rec( Aig_ObjChild1(pObj) );
            if ( !Aig_Regular(pObjLo0)->fMarkA || !Aig_Regular(pObjLo1)->fMarkA )
                continue;
            // remember complemented attribute
            fCompl = Aig_IsComplement(pObjLo0) & Aig_IsComplement(pObjLo1);
            // get the register inputs
//            pObjLi0_ = Aig_Regular(pObjLo0)->pNext;
//            pObjLi1_ = Aig_Regular(pObjLo1)->pNext;
//            pObjLi0__ = Aig_ObjChild0(Aig_Regular(pObjLo0)->pNext);
//            pObjLi1__ = Aig_ObjChild0(Aig_Regular(pObjLo1)->pNext);
            pObjLi0 = Aig_NotCond( Aig_ObjChild0(Aig_Regular(pObjLo0)->pNext), Aig_IsComplement(pObjLo0) );
            pObjLi1 = Aig_NotCond( Aig_ObjChild0(Aig_Regular(pObjLo1)->pNext), Aig_IsComplement(pObjLo1) );
            // create new node
            pObjNew = Aig_And( p, pObjLi0, pObjLi1 );
            pObjNew->fMarkB = 1;
            // create new register
            pObjLo = Aig_ObjCreateCi(p);
            pObjLo->fMarkA = 1;
            pObjLi = Aig_ObjCreateCo( p, Aig_NotCond(pObjNew, fCompl) );
            p->nRegs++;
            pObjLo->pNext = pObjLi;
            pObjLi->pNext = pObjLo;
            // add the buffer
            Aig_ObjDisconnect( p, pObj );
            pObj->Type = AIG_OBJ_BUF;
            p->nObjs[AIG_OBJ_AND]--;
            p->nObjs[AIG_OBJ_BUF]++;
            Aig_ObjConnect( p, pObj, Aig_NotCond(pObjLo, fCompl), NULL );
            // create HAIG if defined
            // mark the change
            fChange = 1;
            // check the limit
            if ( ++Counter >= nStepsMax )
            {
                fChange = 0;
                break;
            }
        }
    }
    // clean the markings
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        pObjLo->fMarkA = 0;
        pObjLo->pNext = pObjLi->pNext = NULL;
    }
    Aig_ManForEachObj( p, pObj, i )
        pObj->fMarkB = 0;
    // remove useless registers
    Aig_ManSeqCleanup( p );
    // rehash the nodes
    return Aig_ManDupOrdered( p ); 
}